

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O3

bool tinyusdz::tydra::anon_unknown_0::TryConvertFacevaryingToVertexMat<tinyusdz::value::matrix3f>
               (vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *src,
               vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *dst,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  pointer puVar5;
  _Hash_node_base *p_Var6;
  pointer pmVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  pointer puVar12;
  mapped_type *pmVar13;
  __node_base _Var14;
  __hash_code __code;
  ulong uVar15;
  float fVar16;
  size_type __n;
  unordered_map<unsigned_int,_tinyusdz::value::matrix3f,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>_>
  vdata;
  uint32_t vidx;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_90;
  value_type local_58;
  
  if (dst == (vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *)0x0) {
    bVar11 = false;
  }
  else {
    puVar12 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
              _M_impl.super__Vector_impl_data._M_start;
    puVar5 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    uVar15 = (long)puVar5 - (long)puVar12 >> 2;
    bVar11 = false;
    if ((((long)(src->
                super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(src->
                super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x71c71c71c71c71c7 - uVar15 == 0
        ) && (2 < uVar15)) {
      local_90._M_buckets = &local_90._M_single_bucket;
      local_90._M_bucket_count = 1;
      local_90._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_90._M_element_count = 0;
      local_90._M_rehash_policy._M_max_load_factor = 1.0;
      local_90._M_rehash_policy._M_next_resize = 0;
      local_90._M_single_bucket = (__node_base_ptr)0x0;
      if (puVar5 == puVar12) {
        __n = 1;
      }
      else {
        uVar15 = 0;
        fVar16 = 0.0;
        do {
          fVar3 = (float)puVar12[uVar15];
          local_58.m[0][0] = fVar3;
          if ((uint)fVar16 < (uint)fVar3) {
            fVar16 = fVar3;
          }
          if (local_90._M_buckets[(ulong)(uint)fVar3 % local_90._M_bucket_count] !=
              (__node_base_ptr)0x0) {
            p_Var6 = local_90._M_buckets[(ulong)(uint)fVar3 % local_90._M_bucket_count]->_M_nxt;
            fVar2 = *(float *)&p_Var6[1]._M_nxt;
            do {
              if (fVar3 == fVar2) {
                pmVar13 = ::std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&local_90,(key_type *)&local_58);
                bVar11 = is_close(pmVar13,(src->
                                          super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar15,
                                  1.1920929e-07);
                if (bVar11) goto LAB_00379bce;
                bVar11 = false;
                goto LAB_00379c57;
              }
              p_Var6 = p_Var6->_M_nxt;
            } while ((p_Var6 != (_Hash_node_base *)0x0) &&
                    (fVar2 = *(float *)&p_Var6[1]._M_nxt,
                    (ulong)(uint)fVar2 % local_90._M_bucket_count ==
                    (ulong)(uint)fVar3 % local_90._M_bucket_count));
          }
          pmVar7 = (src->
                   super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pmVar13 = ::std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&local_90,(key_type *)&local_58);
          uVar8 = *(undefined8 *)(pmVar7[uVar15].m[0] + 2);
          pfVar1 = pmVar7[uVar15].m[1] + 1;
          uVar9 = *(undefined8 *)pfVar1;
          uVar10 = *(undefined8 *)(pfVar1 + 2);
          *(undefined8 *)pmVar13->m[0] = *(undefined8 *)pmVar7[uVar15].m[0];
          *(undefined8 *)(pmVar13->m[0] + 2) = uVar8;
          *(undefined8 *)(pmVar13->m[1] + 1) = uVar9;
          *(undefined8 *)pmVar13->m[2] = uVar10;
          pmVar13->m[2][2] = pmVar7[uVar15].m[2][2];
LAB_00379bce:
          uVar15 = uVar15 + 1;
          puVar12 = (faceVertexIndices->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar15 < (ulong)((long)(faceVertexIndices->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)puVar12
                                 >> 2));
        __n = (size_type)((int)fVar16 + 1);
      }
      local_58.m[0][0] = 1.0;
      local_58.m[0][1] = 0.0;
      local_58.m[0][2] = 0.0;
      local_58.m[1][0] = 0.0;
      local_58.m[1][1] = 1.0;
      local_58.m[1][2] = 0.0;
      local_58.m[2][0] = 0.0;
      local_58.m[2][1] = 0.0;
      local_58.m[2][2] = 1.0;
      ::std::vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::
      _M_fill_assign(dst,__n,&local_58);
      bVar11 = true;
      for (_Var14._M_nxt = local_90._M_before_begin._M_nxt; _Var14._M_nxt != (_Hash_node_base *)0x0;
          _Var14._M_nxt = (_Var14._M_nxt)->_M_nxt) {
        uVar4 = *(uint *)&_Var14._M_nxt[1]._M_nxt;
        pmVar7 = (dst->
                 super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pmVar7[uVar4].m[2][2] = *(float *)((long)&_Var14._M_nxt[5]._M_nxt + 4);
        uVar8 = *(undefined8 *)((long)&_Var14._M_nxt[4]._M_nxt + 4);
        pfVar1 = pmVar7[uVar4].m[1] + 1;
        *(undefined8 *)pfVar1 = *(undefined8 *)((long)&_Var14._M_nxt[3]._M_nxt + 4);
        *(undefined8 *)(pfVar1 + 2) = uVar8;
        uVar8 = *(undefined8 *)((long)&_Var14._M_nxt[2]._M_nxt + 4);
        *(undefined8 *)pmVar7[uVar4].m[0] = *(undefined8 *)((long)&_Var14._M_nxt[1]._M_nxt + 4);
        *(undefined8 *)(pmVar7[uVar4].m[0] + 2) = uVar8;
      }
LAB_00379c57:
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_90);
    }
  }
  return bVar11;
}

Assistant:

bool TryConvertFacevaryingToVertexMat(
    const std::vector<T> &src, std::vector<T> *dst,
    const std::vector<uint32_t> &faceVertexIndices) {
  if (!dst) {
    return false;
  }

  if (src.size() != faceVertexIndices.size()) {
    return false;
  }

  // size must be at least 1 triangle(3 verts).
  if (faceVertexIndices.size() < 3) {
    return false;
  }

  // vidx, value
  std::unordered_map<uint32_t, T> vdata;

  uint32_t max_vidx = 0;
  for (size_t i = 0; i < faceVertexIndices.size(); i++) {
    uint32_t vidx = faceVertexIndices[i];
    max_vidx = (std::max)(vidx, max_vidx);

    if (vdata.count(vidx)) {
      if (!is_close(vdata[vidx], src[i])) {
        return false;
      }
    } else {
      vdata[vidx] = src[i];
    }
  }

  dst->assign(max_vidx + 1, T::identity());

  for (const auto &v : vdata) {
    (*dst)[v.first] = v.second;
  }

  return true;
}